

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

FileInfo * __thiscall slang::SourceManager::getFileInfo(SourceManager *this,BufferID buffer)

{
  pointer pvVar1;
  ulong uVar2;
  ulong uVar3;
  FileInfo *pFVar4;
  
  if (buffer.id == 0) {
    pFVar4 = (FileInfo *)0x0;
  }
  else {
    uVar2 = (ulong)buffer.id;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar3 < uVar2 || uVar3 - uVar2 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x1bd,"SourceManager::FileInfo *slang::SourceManager::getFileInfo(BufferID)");
    }
    pFVar4 = (FileInfo *)0x0;
    if (*(__index_type *)
         ((long)&pvVar1[uVar2].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x30) == '\0') {
      pFVar4 = (FileInfo *)(pvVar1 + uVar2);
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return pFVar4;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}